

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O0

void __thiscall
test_matrix_sparse_insert_insert_or_assign_Test::TestBody
          (test_matrix_sparse_insert_insert_or_assign_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Scalar *pSVar3;
  reference pvVar4;
  size_t sVar5;
  reference this_00;
  size_t *psVar6;
  size_t *psVar7;
  char *in_R9;
  undefined1 auVar8 [16];
  AssertHelper local_11a0;
  Message local_1198;
  undefined1 local_1190 [8];
  AssertionResult gtest_ar_55;
  Message local_1178;
  undefined1 local_1170 [8];
  AssertionResult gtest_ar_54;
  const_iterator local_1140;
  undefined1 local_1120 [8];
  const_iterator iter;
  const_iterator prev;
  value_type *row_vector;
  iterator __end1;
  iterator __begin1;
  Matrix_Sparse *__range1;
  Message local_10a8;
  pointer local_10a0;
  pointer local_1098;
  undefined1 local_1090 [16];
  undefined1 local_1080 [8];
  AssertionResult gtest_ar_53;
  Message local_1068;
  int local_105c;
  pointer local_1058;
  undefined1 local_1050 [8];
  AssertionResult gtest_ar_52;
  Message local_1038;
  int local_102c;
  size_t local_1028;
  undefined1 local_1020 [8];
  AssertionResult gtest_ar_51;
  Message local_1008;
  int local_ffc;
  size_t local_ff8;
  undefined1 local_ff0 [8];
  AssertionResult gtest_ar_50;
  AssertHelper local_fc0;
  Message local_fb8;
  bool local_fa9;
  undefined1 local_fa8 [8];
  AssertionResult gtest_ar__8;
  Message local_f90;
  undefined1 local_f88 [8];
  AssertionResult gtest_ar_49;
  size_t local_f70 [2];
  pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> local_f60;
  AssertHelper local_f38;
  Message local_f30;
  size_t local_f28 [2];
  undefined1 local_f18 [16];
  undefined1 local_f08 [8];
  AssertionResult gtest_ar_48;
  Message local_ef0;
  int local_ee4;
  pointer local_ee0;
  undefined1 local_ed8 [8];
  AssertionResult gtest_ar_47;
  Message local_ec0;
  int local_eb4;
  size_t local_eb0;
  undefined1 local_ea8 [8];
  AssertionResult gtest_ar_46;
  Message local_e90;
  int local_e84;
  size_t local_e80;
  undefined1 local_e78 [8];
  AssertionResult gtest_ar_45;
  AssertHelper local_e48;
  Message local_e40;
  undefined1 local_e38 [8];
  AssertionResult gtest_ar__7;
  Message local_e20;
  undefined1 local_e18 [8];
  AssertionResult gtest_ar_44;
  size_t local_e00 [2];
  pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> local_df0;
  AssertHelper local_dc8;
  Message local_dc0;
  size_t local_db8 [2];
  undefined1 local_da8 [16];
  undefined1 local_d98 [8];
  AssertionResult gtest_ar_43;
  Message local_d80;
  int local_d74;
  pointer local_d70;
  undefined1 local_d68 [8];
  AssertionResult gtest_ar_42;
  Message local_d50;
  int local_d44;
  size_t local_d40;
  undefined1 local_d38 [8];
  AssertionResult gtest_ar_41;
  AssertHelper local_d08;
  Message local_d00;
  undefined1 local_cf8 [8];
  AssertionResult gtest_ar__6;
  Message local_ce0;
  undefined1 local_cd8 [8];
  AssertionResult gtest_ar_40;
  size_t local_cc0 [2];
  pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> local_cb0;
  AssertHelper local_c88;
  Message local_c80;
  size_t local_c78 [2];
  undefined1 local_c68 [16];
  undefined1 local_c58 [8];
  AssertionResult gtest_ar_39;
  Message local_c40;
  pointer local_c38;
  pointer local_c30;
  undefined1 local_c28 [16];
  undefined1 local_c18 [8];
  AssertionResult gtest_ar_38;
  Message local_c00;
  pointer local_bf8;
  pointer local_bf0;
  undefined1 local_be8 [16];
  undefined1 local_bd8 [8];
  AssertionResult gtest_ar_37;
  Message local_bc0;
  pointer local_bb8;
  pointer local_bb0;
  undefined1 local_ba8 [16];
  undefined1 local_b98 [8];
  AssertionResult gtest_ar_36;
  Message local_b80;
  pointer local_b78;
  pointer local_b70;
  undefined1 local_b68 [16];
  undefined1 local_b58 [8];
  AssertionResult gtest_ar_35;
  Message local_b40;
  pointer local_b38;
  pointer local_b30;
  undefined1 local_b28 [16];
  undefined1 local_b18 [8];
  AssertionResult gtest_ar_34;
  Message local_b00;
  int local_af4;
  pointer local_af0;
  undefined1 local_ae8 [8];
  AssertionResult gtest_ar_33;
  AssertHelper local_ab8;
  Message local_ab0;
  bool local_aa1;
  undefined1 local_aa0 [8];
  AssertionResult gtest_ar__5;
  Message local_a88;
  undefined1 local_a80 [8];
  AssertionResult gtest_ar_32;
  size_t local_a68 [2];
  pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> local_a58;
  AssertHelper local_a30;
  Message local_a28;
  size_t local_a20 [2];
  undefined1 local_a10 [16];
  undefined1 local_a00 [8];
  AssertionResult gtest_ar_31;
  Message local_9e8;
  pointer local_9e0;
  pointer local_9d8;
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [8];
  AssertionResult gtest_ar_30;
  Message local_9a8;
  pointer local_9a0;
  pointer local_998;
  undefined1 local_990 [16];
  undefined1 local_980 [8];
  AssertionResult gtest_ar_29;
  Message local_968;
  pointer local_960;
  pointer local_958;
  undefined1 local_950 [16];
  undefined1 local_940 [8];
  AssertionResult gtest_ar_28;
  Message local_928;
  pointer local_920;
  pointer local_918;
  undefined1 local_910 [16];
  undefined1 local_900 [8];
  AssertionResult gtest_ar_27;
  Message local_8e8;
  pointer local_8e0;
  pointer local_8d8;
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [8];
  AssertionResult gtest_ar_26;
  Message local_8a8;
  int local_89c;
  pointer local_898;
  undefined1 local_890 [8];
  AssertionResult gtest_ar_25;
  AssertHelper local_860;
  Message local_858;
  undefined1 local_850 [8];
  AssertionResult gtest_ar__4;
  Message local_838;
  undefined1 local_830 [8];
  AssertionResult gtest_ar_24;
  size_t local_818 [2];
  pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> local_808;
  AssertHelper local_7e0;
  Message local_7d8;
  size_t local_7d0 [2];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [8];
  AssertionResult gtest_ar_23;
  Message local_798;
  pointer local_790;
  pointer local_788;
  undefined1 local_780 [16];
  undefined1 local_770 [8];
  AssertionResult gtest_ar_22;
  Message local_758;
  pointer local_750;
  pointer local_748;
  undefined1 local_740 [16];
  undefined1 local_730 [8];
  AssertionResult gtest_ar_21;
  Message local_718;
  pointer local_710;
  pointer local_708;
  undefined1 local_700 [16];
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar_20;
  Message local_6d8;
  pointer local_6d0;
  pointer local_6c8;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar_19;
  Message local_698;
  int local_68c;
  pointer local_688;
  undefined1 local_680 [8];
  AssertionResult gtest_ar_18;
  AssertHelper local_650;
  Message local_648;
  undefined1 local_640 [8];
  AssertionResult gtest_ar__3;
  Message local_628;
  undefined1 local_620 [8];
  AssertionResult gtest_ar_17;
  size_t local_608 [2];
  pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> local_5f8;
  AssertHelper local_5d0;
  Message local_5c8;
  size_t local_5c0 [2];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar_16;
  Message local_588;
  pointer local_580;
  pointer local_578;
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  AssertionResult gtest_ar_15;
  Message local_548;
  pointer local_540;
  pointer local_538;
  undefined1 local_530 [16];
  undefined1 local_520 [8];
  AssertionResult gtest_ar_14;
  Message local_508;
  pointer local_500;
  pointer local_4f8;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_13;
  Message local_4c8;
  int local_4bc;
  pointer local_4b8;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_480;
  Message local_478;
  undefined1 local_470 [8];
  AssertionResult gtest_ar__2;
  Message local_458;
  undefined1 local_450 [8];
  AssertionResult gtest_ar_11;
  size_t local_438 [2];
  pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> local_428;
  AssertHelper local_400;
  Message local_3f8;
  size_t local_3f0 [2];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_10;
  Message local_3b8;
  pointer local_3b0;
  pointer local_3a8;
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  AssertionResult gtest_ar_9;
  Message local_378;
  pointer local_370;
  pointer local_368;
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  AssertionResult gtest_ar_8;
  Message local_338;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_300;
  Message local_2f8;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar__1;
  Message local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_6;
  size_t local_2b8 [2];
  pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> local_2a8;
  AssertHelper local_280;
  Message local_278;
  size_t local_270 [2];
  undefined1 local_260 [16];
  undefined1 local_250 [8];
  AssertionResult gtest_ar_5;
  Message local_238;
  pointer local_230;
  pointer local_228;
  undefined1 local_220 [16];
  undefined1 local_210 [8];
  AssertionResult gtest_ar_4;
  Message local_1f8;
  int local_1ec;
  pointer local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_1b0;
  Message local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_2;
  size_t local_168 [2];
  undefined1 local_158 [8];
  pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> iter_bool_pair;
  Message local_128;
  size_t local_120 [2];
  undefined1 local_110 [16];
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  Message local_e8;
  int local_dc;
  pointer local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  double local_98;
  size_t local_90 [4];
  size_t local_70 [2];
  undefined1 local_60 [8];
  Matrix_Sparse matrix;
  test_matrix_sparse_insert_insert_or_assign_Test *this_local;
  
  matrix.column_size = (size_t)this;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_60);
  local_70[1] = 5;
  local_70[0] = 5;
  Disa::Matrix_Sparse::resize((Matrix_Sparse *)local_60,local_70 + 1,local_70);
  local_90[1] = 3;
  local_90[0] = 2;
  local_98 = 1.0;
  Disa::Matrix_Sparse::insert
            ((pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> *)
             &gtest_ar.message_,(Matrix_Sparse *)local_60,local_90 + 1,local_90,&local_98);
  local_d8 = (pointer)Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_dc = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_d0,"matrix.size_non_zero()","1",(unsigned_long *)&local_d8,&local_dc)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0xe9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  local_120[1] = 3;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_110,(size_t *)local_60);
  local_120[0] = 2;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_110,local_120);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_100,"matrix[3][2]","1.0",*pSVar3,1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iter_bool_pair.second,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0xea,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iter_bool_pair.second,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iter_bool_pair.second);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  local_168[1] = 3;
  local_168[0] = 1;
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4008000000000000;
  Disa::Matrix_Sparse::insert
            ((pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> *)local_158,
             (Matrix_Sparse *)local_60,local_168 + 1,local_168,(double *)&gtest_ar_2.message_);
  pvVar4 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::
           operator*<Disa::Matrix_Sparse,_true>
                     ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_158);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_180,"*iter_bool_pair.first","3.0",*pvVar4,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0xed,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a0,(bool *)&iter_bool_pair.first.matrix,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_1a0,
               (AssertionResult *)"iter_bool_pair.second","false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_3.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0xee,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  local_1e8 = (pointer)Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_1ec = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1e0,"matrix.size_non_zero()","2",(unsigned_long *)&local_1e8,
             &local_1ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0xef,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  local_228 = (pointer)0x3;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_220,(size_t *)local_60);
  local_230 = (pointer)0x1;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_220,(size_t *)&local_230);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_210,"matrix[3][1]","3.0",*pSVar3,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0xf0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  local_270[1] = 3;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_260,(size_t *)local_60);
  local_270[0] = 2;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_260,local_270);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_250,"matrix[3][2]","1.0",*pSVar3,1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0xf1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_280,&local_278);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  local_2b8[1] = 2;
  local_2b8[0] = 1;
  gtest_ar_6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4010000000000000;
  Disa::Matrix_Sparse::insert
            (&local_2a8,(Matrix_Sparse *)local_60,local_2b8 + 1,local_2b8,
             (double *)&gtest_ar_6.message_);
  std::pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool>::operator=
            ((pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> *)local_158,
             &local_2a8);
  pvVar4 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::
           operator*<Disa::Matrix_Sparse,_true>
                     ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_158);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2d0,"*iter_bool_pair.first","4.0",*pvVar4,4.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0xf4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2f0,(bool *)&iter_bool_pair.first.matrix,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7.message_,(internal *)local_2f0,
               (AssertionResult *)"iter_bool_pair.second","false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_7.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0xf5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  sVar5 = Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  auVar8._8_4_ = (int)(sVar5 >> 0x20);
  auVar8._0_8_ = sVar5;
  auVar8._12_4_ = 0x45300000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_330,"matrix.size_non_zero()","3",
             (auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0),3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0xf6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  local_368 = (pointer)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_360,(size_t *)local_60);
  local_370 = (pointer)0x1;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_360,(size_t *)&local_370);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_350,"matrix[2][1]","4.0",*pSVar3,4.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0xf7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  local_3a8 = (pointer)0x3;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_3a0,(size_t *)local_60);
  local_3b0 = (pointer)0x1;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_3a0,(size_t *)&local_3b0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_390,"matrix[3][1]","3.0",*pSVar3,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0xf8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  local_3f0[1] = 3;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_3e0,(size_t *)local_60);
  local_3f0[0] = 2;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_3e0,local_3f0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_3d0,"matrix[3][2]","1.0",*pSVar3,1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0xf9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_400,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper(&local_400);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  local_438[1] = 2;
  local_438[0] = 4;
  gtest_ar_11.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4014000000000000;
  Disa::Matrix_Sparse::insert
            (&local_428,(Matrix_Sparse *)local_60,local_438 + 1,local_438,
             (double *)&gtest_ar_11.message_);
  std::pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool>::operator=
            ((pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> *)local_158,
             &local_428);
  pvVar4 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::
           operator*<Disa::Matrix_Sparse,_true>
                     ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_158);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_450,"*iter_bool_pair.first","5.0",*pvVar4,5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
  if (!bVar1) {
    testing::Message::Message(&local_458);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0xfc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_458);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_470,(bool *)&iter_bool_pair.first.matrix,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar1) {
    testing::Message::Message(&local_478);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_12.message_,(internal *)local_470,
               (AssertionResult *)"iter_bool_pair.second","false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_12.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_480,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0xfd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_480,&local_478);
    testing::internal::AssertHelper::~AssertHelper(&local_480);
    std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  local_4b8 = (pointer)Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_4bc = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_4b0,"matrix.size_non_zero()","4",(unsigned_long *)&local_4b8,
             &local_4bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0xfe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  local_4f8 = (pointer)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_4f0,(size_t *)local_60);
  local_500 = (pointer)0x1;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_4f0,(size_t *)&local_500);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_4e0,"matrix[2][1]","4.0",*pSVar3,4.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_508);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0xff,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  local_538 = (pointer)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_530,(size_t *)local_60);
  local_540 = (pointer)0x4;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_530,(size_t *)&local_540);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_520,"matrix[2][4]","5.0",*pSVar3,5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
  if (!bVar1) {
    testing::Message::Message(&local_548);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x100,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
  local_578 = (pointer)0x3;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_570,(size_t *)local_60);
  local_580 = (pointer)0x1;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_570,(size_t *)&local_580);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_560,"matrix[3][1]","3.0",*pSVar3,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
  if (!bVar1) {
    testing::Message::Message(&local_588);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_560);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x101,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_588);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
  local_5c0[1] = 3;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_5b0,(size_t *)local_60);
  local_5c0[0] = 2;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_5b0,local_5c0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_5a0,"matrix[3][2]","1.0",*pSVar3,1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a0);
  if (!bVar1) {
    testing::Message::Message(&local_5c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x102,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5d0,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    testing::Message::~Message(&local_5c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
  local_608[1] = 4;
  local_608[0] = 0;
  gtest_ar_17.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4020000000000000;
  Disa::Matrix_Sparse::insert
            (&local_5f8,(Matrix_Sparse *)local_60,local_608 + 1,local_608,
             (double *)&gtest_ar_17.message_);
  std::pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool>::operator=
            ((pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> *)local_158,
             &local_5f8);
  pvVar4 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::
           operator*<Disa::Matrix_Sparse,_true>
                     ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_158);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_620,"*iter_bool_pair.first","8.0",*pvVar4,8.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar1) {
    testing::Message::Message(&local_628);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_620);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x105,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_628);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_640,(bool *)&iter_bool_pair.first.matrix,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar1) {
    testing::Message::Message(&local_648);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_18.message_,(internal *)local_640,
               (AssertionResult *)"iter_bool_pair.second","false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_18.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_650,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x106,pcVar2);
    testing::internal::AssertHelper::operator=(&local_650,&local_648);
    testing::internal::AssertHelper::~AssertHelper(&local_650);
    std::__cxx11::string::~string((string *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_648);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  local_688 = (pointer)Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_68c = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_680,"matrix.size_non_zero()","5",(unsigned_long *)&local_688,
             &local_68c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
  if (!bVar1) {
    testing::Message::Message(&local_698);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_680);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x107,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_698);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
  local_6c8 = (pointer)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_6c0,(size_t *)local_60);
  local_6d0 = (pointer)0x1;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_6c0,(size_t *)&local_6d0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_6b0,"matrix[2][1]","4.0",*pSVar3,4.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
  if (!bVar1) {
    testing::Message::Message(&local_6d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x108,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_6d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_6d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
  local_708 = (pointer)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_700,(size_t *)local_60);
  local_710 = (pointer)0x4;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_700,(size_t *)&local_710);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_6f0,"matrix[2][4]","5.0",*pSVar3,5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f0);
  if (!bVar1) {
    testing::Message::Message(&local_718);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x109,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_718);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_718);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f0);
  local_748 = (pointer)0x3;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_740,(size_t *)local_60);
  local_750 = (pointer)0x1;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_740,(size_t *)&local_750);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_730,"matrix[3][1]","3.0",*pSVar3,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
  if (!bVar1) {
    testing::Message::Message(&local_758);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_730);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x10a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
  local_788 = (pointer)0x3;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_780,(size_t *)local_60);
  local_790 = (pointer)0x2;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_780,(size_t *)&local_790);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_770,"matrix[3][2]","1.0",*pSVar3,1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
  if (!bVar1) {
    testing::Message::Message(&local_798);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_770);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x10b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_798);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
  local_7d0[1] = 4;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_7c0,(size_t *)local_60);
  local_7d0[0] = 0;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_7c0,local_7d0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_7b0,"matrix[4][0]","8.0",*pSVar3,8.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b0);
  if (!bVar1) {
    testing::Message::Message(&local_7d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x10c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7e0,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    testing::Message::~Message(&local_7d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b0);
  local_818[1] = 4;
  local_818[0] = 4;
  gtest_ar_24.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0xc014000000000000;
  Disa::Matrix_Sparse::insert
            (&local_808,(Matrix_Sparse *)local_60,local_818 + 1,local_818,
             (double *)&gtest_ar_24.message_);
  std::pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool>::operator=
            ((pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> *)local_158,
             &local_808);
  pvVar4 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::
           operator*<Disa::Matrix_Sparse,_true>
                     ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_158);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_830,"*iter_bool_pair.first","-5.0",*pvVar4,-5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_830);
  if (!bVar1) {
    testing::Message::Message(&local_838);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_830);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x10f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_838);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_838);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_830);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_850,(bool *)&iter_bool_pair.first.matrix,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_850);
  if (!bVar1) {
    testing::Message::Message(&local_858);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_25.message_,(internal *)local_850,
               (AssertionResult *)"iter_bool_pair.second","false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_25.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_860,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x110,pcVar2);
    testing::internal::AssertHelper::operator=(&local_860,&local_858);
    testing::internal::AssertHelper::~AssertHelper(&local_860);
    std::__cxx11::string::~string((string *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_858);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_850);
  local_898 = (pointer)Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_89c = 6;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_890,"matrix.size_non_zero()","6",(unsigned_long *)&local_898,
             &local_89c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_890);
  if (!bVar1) {
    testing::Message::Message(&local_8a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_890);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x111,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_8a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_8a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_890);
  local_8d8 = (pointer)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_8d0,(size_t *)local_60);
  local_8e0 = (pointer)0x1;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_8d0,(size_t *)&local_8e0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_8c0,"matrix[2][1]","4.0",*pSVar3,4.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c0);
  if (!bVar1) {
    testing::Message::Message(&local_8e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x112,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_8e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_8e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c0);
  local_918 = (pointer)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_910,(size_t *)local_60);
  local_920 = (pointer)0x4;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_910,(size_t *)&local_920);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_900,"matrix[2][4]","5.0",*pSVar3,5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_900);
  if (!bVar1) {
    testing::Message::Message(&local_928);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_900);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x113,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_928);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_928);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_900);
  local_958 = (pointer)0x3;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_950,(size_t *)local_60);
  local_960 = (pointer)0x1;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_950,(size_t *)&local_960);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_940,"matrix[3][1]","3.0",*pSVar3,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_940);
  if (!bVar1) {
    testing::Message::Message(&local_968);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_940);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x114,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_968);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_968);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_940);
  local_998 = (pointer)0x3;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_990,(size_t *)local_60);
  local_9a0 = (pointer)0x2;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_990,(size_t *)&local_9a0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_980,"matrix[3][2]","1.0",*pSVar3,1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_980);
  if (!bVar1) {
    testing::Message::Message(&local_9a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_980);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x115,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_9a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_9a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_980);
  local_9d8 = (pointer)0x4;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_9d0,(size_t *)local_60);
  local_9e0 = (pointer)0x0;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_9d0,(size_t *)&local_9e0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_9c0,"matrix[4][0]","8.0",*pSVar3,8.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c0);
  if (!bVar1) {
    testing::Message::Message(&local_9e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x116,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_9e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_9e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c0);
  local_a20[1] = 4;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_a10,(size_t *)local_60);
  local_a20[0] = 4;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_a10,local_a20);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_a00,"matrix[4][4]","-5.0",*pSVar3,-5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a00);
  if (!bVar1) {
    testing::Message::Message(&local_a28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a00);
    testing::internal::AssertHelper::AssertHelper
              (&local_a30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x117,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a30,&local_a28);
    testing::internal::AssertHelper::~AssertHelper(&local_a30);
    testing::Message::~Message(&local_a28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a00);
  local_a68[1] = 3;
  local_a68[0] = 2;
  gtest_ar_32.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4000000000000000;
  Disa::Matrix_Sparse::insert
            (&local_a58,(Matrix_Sparse *)local_60,local_a68 + 1,local_a68,
             (double *)&gtest_ar_32.message_);
  std::pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool>::operator=
            ((pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> *)local_158,
             &local_a58);
  pvVar4 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::
           operator*<Disa::Matrix_Sparse,_true>
                     ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_158);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_a80,"*iter_bool_pair.first","1.0",*pvVar4,1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a80);
  if (!bVar1) {
    testing::Message::Message(&local_a88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x11a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_a88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_a88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a80);
  local_aa1 = (bool)(~(byte)iter_bool_pair.first.matrix & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_aa0,&local_aa1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_aa0);
  if (!bVar1) {
    testing::Message::Message(&local_ab0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_33.message_,(internal *)local_aa0,
               (AssertionResult *)"iter_bool_pair.second","true","false",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_33.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_ab8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x11b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ab8,&local_ab0);
    testing::internal::AssertHelper::~AssertHelper(&local_ab8);
    std::__cxx11::string::~string((string *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_ab0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_aa0);
  local_af0 = (pointer)Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_af4 = 6;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_ae8,"matrix.size_non_zero()","6",(unsigned_long *)&local_af0,
             &local_af4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae8);
  if (!bVar1) {
    testing::Message::Message(&local_b00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ae8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x11c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,&local_b00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_b00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae8);
  local_b30 = (pointer)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_b28,(size_t *)local_60);
  local_b38 = (pointer)0x1;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_b28,(size_t *)&local_b38);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b18,"matrix[2][1]","4.0",*pSVar3,4.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b18);
  if (!bVar1) {
    testing::Message::Message(&local_b40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x11d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_b40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_b40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b18);
  local_b70 = (pointer)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_b68,(size_t *)local_60);
  local_b78 = (pointer)0x4;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_b68,(size_t *)&local_b78);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b58,"matrix[2][4]","5.0",*pSVar3,5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b58);
  if (!bVar1) {
    testing::Message::Message(&local_b80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x11e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_36.message_,&local_b80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_36.message_);
    testing::Message::~Message(&local_b80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b58);
  local_bb0 = (pointer)0x3;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_ba8,(size_t *)local_60);
  local_bb8 = (pointer)0x1;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_ba8,(size_t *)&local_bb8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b98,"matrix[3][1]","3.0",*pSVar3,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b98);
  if (!bVar1) {
    testing::Message::Message(&local_bc0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x11f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,&local_bc0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(&local_bc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b98);
  local_bf0 = (pointer)0x3;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_be8,(size_t *)local_60);
  local_bf8 = (pointer)0x2;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_be8,(size_t *)&local_bf8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_bd8,"matrix[3][2]","1.0",*pSVar3,1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bd8);
  if (!bVar1) {
    testing::Message::Message(&local_c00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bd8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x120,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_38.message_,&local_c00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_38.message_);
    testing::Message::~Message(&local_c00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bd8);
  local_c30 = (pointer)0x4;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_c28,(size_t *)local_60);
  local_c38 = (pointer)0x0;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_c28,(size_t *)&local_c38);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_c18,"matrix[4][0]","8.0",*pSVar3,8.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c18);
  if (!bVar1) {
    testing::Message::Message(&local_c40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x121,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_39.message_,&local_c40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
    testing::Message::~Message(&local_c40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c18);
  local_c78[1] = 4;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_c68,(size_t *)local_60);
  local_c78[0] = 4;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_c68,local_c78);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_c58,"matrix[4][4]","-5.0",*pSVar3,-5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c58);
  if (!bVar1) {
    testing::Message::Message(&local_c80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c58);
    testing::internal::AssertHelper::AssertHelper
              (&local_c88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x122,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c88,&local_c80);
    testing::internal::AssertHelper::~AssertHelper(&local_c88);
    testing::Message::~Message(&local_c80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c58);
  local_cc0[1] = 6;
  local_cc0[0] = 2;
  gtest_ar_40.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4024000000000000;
  Disa::Matrix_Sparse::insert
            (&local_cb0,(Matrix_Sparse *)local_60,local_cc0 + 1,local_cc0,
             (double *)&gtest_ar_40.message_);
  std::pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool>::operator=
            ((pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> *)local_158,
             &local_cb0);
  pvVar4 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::
           operator*<Disa::Matrix_Sparse,_true>
                     ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_158);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_cd8,"*iter_bool_pair.first","10.0",*pvVar4,10.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cd8);
  if (!bVar1) {
    testing::Message::Message(&local_ce0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cd8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x125,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__6.message_,&local_ce0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_ce0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cd8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_cf8,(bool *)&iter_bool_pair.first.matrix,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cf8);
  if (!bVar1) {
    testing::Message::Message(&local_d00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_41.message_,(internal *)local_cf8,
               (AssertionResult *)"iter_bool_pair.second","false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_41.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_d08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x126,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d08,&local_d00);
    testing::internal::AssertHelper::~AssertHelper(&local_d08);
    std::__cxx11::string::~string((string *)&gtest_ar_41.message_);
    testing::Message::~Message(&local_d00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cf8);
  local_d40 = Disa::Matrix_Sparse::size_row((Matrix_Sparse *)local_60);
  local_d44 = 7;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_d38,"matrix.size_row()","7",&local_d40,&local_d44);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d38);
  if (!bVar1) {
    testing::Message::Message(&local_d50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_42.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x127,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_42.message_,&local_d50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_42.message_);
    testing::Message::~Message(&local_d50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d38);
  local_d70 = (pointer)Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_d74 = 7;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_d68,"matrix.size_non_zero()","7",(unsigned_long *)&local_d70,
             &local_d74);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d68);
  if (!bVar1) {
    testing::Message::Message(&local_d80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_43.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x128,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_43.message_,&local_d80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_43.message_);
    testing::Message::~Message(&local_d80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d68);
  local_db8[1] = 6;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_da8,(size_t *)local_60);
  local_db8[0] = 2;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_da8,local_db8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_d98,"matrix[6][2]","10.0",*pSVar3,10.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d98);
  if (!bVar1) {
    testing::Message::Message(&local_dc0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d98);
    testing::internal::AssertHelper::AssertHelper
              (&local_dc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x129,pcVar2);
    testing::internal::AssertHelper::operator=(&local_dc8,&local_dc0);
    testing::internal::AssertHelper::~AssertHelper(&local_dc8);
    testing::Message::~Message(&local_dc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d98);
  local_e00[1] = 2;
  local_e00[0] = 6;
  gtest_ar_44.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4049000000000000;
  Disa::Matrix_Sparse::insert
            (&local_df0,(Matrix_Sparse *)local_60,local_e00 + 1,local_e00,
             (double *)&gtest_ar_44.message_);
  std::pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool>::operator=
            ((pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> *)local_158,
             &local_df0);
  pvVar4 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::
           operator*<Disa::Matrix_Sparse,_true>
                     ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_158);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_e18,"*iter_bool_pair.first","50.0",*pvVar4,50.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e18);
  if (!bVar1) {
    testing::Message::Message(&local_e20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,300,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7.message_,&local_e20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_e20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e18);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e38,(bool *)&iter_bool_pair.first.matrix,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e38);
  if (!bVar1) {
    testing::Message::Message(&local_e40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_45.message_,(internal *)local_e38,
               (AssertionResult *)"iter_bool_pair.second","false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_45.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_e48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x12d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e48,&local_e40);
    testing::internal::AssertHelper::~AssertHelper(&local_e48);
    std::__cxx11::string::~string((string *)&gtest_ar_45.message_);
    testing::Message::~Message(&local_e40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e38);
  local_e80 = Disa::Matrix_Sparse::size_row((Matrix_Sparse *)local_60);
  local_e84 = 7;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_e78,"matrix.size_row()","7",&local_e80,&local_e84);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e78);
  if (!bVar1) {
    testing::Message::Message(&local_e90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_46.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x12e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_46.message_,&local_e90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_46.message_);
    testing::Message::~Message(&local_e90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e78);
  local_eb0 = Disa::Matrix_Sparse::size_column((Matrix_Sparse *)local_60);
  local_eb4 = 7;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_ea8,"matrix.size_column()","7",&local_eb0,&local_eb4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ea8);
  if (!bVar1) {
    testing::Message::Message(&local_ec0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ea8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_47.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x12f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_47.message_,&local_ec0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_47.message_);
    testing::Message::~Message(&local_ec0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ea8);
  local_ee0 = (pointer)Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_ee4 = 8;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_ed8,"matrix.size_non_zero()","8",(unsigned_long *)&local_ee0,
             &local_ee4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ed8);
  if (!bVar1) {
    testing::Message::Message(&local_ef0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ed8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_48.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x130,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_48.message_,&local_ef0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_48.message_);
    testing::Message::~Message(&local_ef0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ed8);
  local_f28[1] = 2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_f18,(size_t *)local_60);
  local_f28[0] = 6;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_f18,local_f28);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_f08,"matrix[2][6]","50.0",*pSVar3,50.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f08);
  if (!bVar1) {
    testing::Message::Message(&local_f30);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f08);
    testing::internal::AssertHelper::AssertHelper
              (&local_f38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x131,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f38,&local_f30);
    testing::internal::AssertHelper::~AssertHelper(&local_f38);
    testing::Message::~Message(&local_f30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f08);
  local_f70[1] = 2;
  local_f70[0] = 6;
  gtest_ar_49.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0xc049000000000000;
  Disa::Matrix_Sparse::insert_or_assign
            (&local_f60,(Matrix_Sparse *)local_60,local_f70 + 1,local_f70,
             (double *)&gtest_ar_49.message_);
  std::pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool>::operator=
            ((pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> *)local_158,
             &local_f60);
  pvVar4 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::
           operator*<Disa::Matrix_Sparse,_true>
                     ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_158);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_f88,"*iter_bool_pair.first","-50.0",*pvVar4,-50.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f88);
  if (!bVar1) {
    testing::Message::Message(&local_f90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x134,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__8.message_,&local_f90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_f90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f88);
  local_fa9 = (bool)(~(byte)iter_bool_pair.first.matrix & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_fa8,&local_fa9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fa8);
  if (!bVar1) {
    testing::Message::Message(&local_fb8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_50.message_,(internal *)local_fa8,
               (AssertionResult *)"iter_bool_pair.second","true","false",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_50.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_fc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x135,pcVar2);
    testing::internal::AssertHelper::operator=(&local_fc0,&local_fb8);
    testing::internal::AssertHelper::~AssertHelper(&local_fc0);
    std::__cxx11::string::~string((string *)&gtest_ar_50.message_);
    testing::Message::~Message(&local_fb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fa8);
  local_ff8 = Disa::Matrix_Sparse::size_row((Matrix_Sparse *)local_60);
  local_ffc = 7;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_ff0,"matrix.size_row()","7",&local_ff8,&local_ffc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ff0);
  if (!bVar1) {
    testing::Message::Message(&local_1008);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ff0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_51.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x136,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_51.message_,&local_1008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_51.message_);
    testing::Message::~Message(&local_1008);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ff0);
  local_1028 = Disa::Matrix_Sparse::size_column((Matrix_Sparse *)local_60);
  local_102c = 7;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1020,"matrix.size_column()","7",&local_1028,&local_102c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1020);
  if (!bVar1) {
    testing::Message::Message(&local_1038);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1020);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_52.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x137,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_52.message_,&local_1038);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_52.message_);
    testing::Message::~Message(&local_1038);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1020);
  local_1058 = (pointer)Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_105c = 8;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1050,"matrix.size_non_zero()","8",(unsigned_long *)&local_1058,
             &local_105c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1050);
  if (!bVar1) {
    testing::Message::Message(&local_1068);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1050);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_53.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x138,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_53.message_,&local_1068);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_53.message_);
    testing::Message::~Message(&local_1068);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1050);
  local_1098 = (pointer)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_1090,(size_t *)local_60);
  local_10a0 = (pointer)0x6;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_1090,(size_t *)&local_10a0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1080,"matrix[2][6]","-50.0",*pSVar3,-50.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1080);
  if (!bVar1) {
    testing::Message::Message(&local_10a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1080);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__range1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x139,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__range1,&local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range1);
    testing::Message::~Message(&local_10a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1080);
  Disa::Matrix_Sparse::begin((Matrix_Sparse *)&__end1.matrix_row.row_index);
  Disa::Matrix_Sparse::end((Matrix_Sparse *)&row_vector);
  while (bVar1 = Disa::Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator!=
                           ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)
                            &__end1.matrix_row.row_index,
                            (Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&row_vector), bVar1)
  {
    this_00 = Disa::Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::
              operator*<Disa::Matrix_Sparse,_true>
                        ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)
                         &__end1.matrix_row.row_index);
    Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::begin((const_iterator *)&iter.matrix,this_00);
    Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::cbegin((const_iterator *)local_1120,this_00);
    while( true ) {
      Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::cend(&local_1140,this_00);
      bVar1 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::operator!=
                        ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_1120,
                         &local_1140);
      if (!bVar1) break;
      Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::begin
                ((const_iterator *)&gtest_ar_54.message_,this_00);
      bVar1 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::operator!=
                        ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_1120,
                         (Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)
                         &gtest_ar_54.message_);
      if (bVar1) {
        psVar6 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_column
                           ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_1120)
        ;
        psVar7 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_column
                           ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)
                            &iter.matrix);
        testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
                  ((internal *)local_1170,"iter.i_column()","prev.i_column()",psVar6,psVar7);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1170);
        if (!bVar1) {
          testing::Message::Message(&local_1178);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1170);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_55.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                     ,0x140,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_55.message_,&local_1178);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_55.message_);
          testing::Message::~Message(&local_1178);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1170);
        psVar6 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_row
                           ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_1120)
        ;
        psVar7 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_row
                           ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)
                            &iter.matrix);
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  ((EqHelper *)local_1190,"iter.i_row()","prev.i_row()",psVar6,psVar7);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1190);
        if (!bVar1) {
          testing::Message::Message(&local_1198);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1190);
          testing::internal::AssertHelper::AssertHelper
                    (&local_11a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                     ,0x141,pcVar2);
          testing::internal::AssertHelper::operator=(&local_11a0,&local_1198);
          testing::internal::AssertHelper::~AssertHelper(&local_11a0);
          testing::Message::~Message(&local_1198);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1190);
        Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::operator++
                  ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)&iter.matrix);
      }
      Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::operator++
                ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_1120);
    }
    Disa::Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator++
              ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&__end1.matrix_row.row_index);
  }
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_60);
  return;
}

Assistant:

TEST(test_matrix_sparse, insert_insert_or_assign) {
  Matrix_Sparse matrix;
  matrix.resize(5, 5);

  matrix.insert(3, 2, 1);
  EXPECT_EQ(matrix.size_non_zero(), 1);
  EXPECT_DOUBLE_EQ(matrix[3][2], 1.0);

  auto iter_bool_pair = matrix.insert(3, 1, 3);  // out of order testing - will check order at the end.
  EXPECT_DOUBLE_EQ(*iter_bool_pair.first, 3.0);
  EXPECT_TRUE(iter_bool_pair.second);
  EXPECT_EQ(matrix.size_non_zero(), 2);
  EXPECT_DOUBLE_EQ(matrix[3][1], 3.0);
  EXPECT_DOUBLE_EQ(matrix[3][2], 1.0);

  iter_bool_pair = matrix.insert(2, 1, 4);
  EXPECT_DOUBLE_EQ(*iter_bool_pair.first, 4.0);
  EXPECT_TRUE(iter_bool_pair.second);
  EXPECT_DOUBLE_EQ(matrix.size_non_zero(), 3);
  EXPECT_DOUBLE_EQ(matrix[2][1], 4.0);
  EXPECT_DOUBLE_EQ(matrix[3][1], 3.0);
  EXPECT_DOUBLE_EQ(matrix[3][2], 1.0);

  iter_bool_pair = matrix.insert(2, 4, 5);  // last of columns test
  EXPECT_DOUBLE_EQ(*iter_bool_pair.first, 5.0);
  EXPECT_TRUE(iter_bool_pair.second);
  EXPECT_EQ(matrix.size_non_zero(), 4);
  EXPECT_DOUBLE_EQ(matrix[2][1], 4.0);
  EXPECT_DOUBLE_EQ(matrix[2][4], 5.0);
  EXPECT_DOUBLE_EQ(matrix[3][1], 3.0);
  EXPECT_DOUBLE_EQ(matrix[3][2], 1.0);

  iter_bool_pair = matrix.insert(4, 0, 8);  // last of rows test
  EXPECT_DOUBLE_EQ(*iter_bool_pair.first, 8.0);
  EXPECT_TRUE(iter_bool_pair.second);
  EXPECT_EQ(matrix.size_non_zero(), 5);
  EXPECT_DOUBLE_EQ(matrix[2][1], 4.0);
  EXPECT_DOUBLE_EQ(matrix[2][4], 5.0);
  EXPECT_DOUBLE_EQ(matrix[3][1], 3.0);
  EXPECT_DOUBLE_EQ(matrix[3][2], 1.0);
  EXPECT_DOUBLE_EQ(matrix[4][0], 8.0);

  iter_bool_pair = matrix.insert(4, 4, -5);  // last row and column test
  EXPECT_DOUBLE_EQ(*iter_bool_pair.first, -5.0);
  EXPECT_TRUE(iter_bool_pair.second);
  EXPECT_EQ(matrix.size_non_zero(), 6);
  EXPECT_DOUBLE_EQ(matrix[2][1], 4.0);
  EXPECT_DOUBLE_EQ(matrix[2][4], 5.0);
  EXPECT_DOUBLE_EQ(matrix[3][1], 3.0);
  EXPECT_DOUBLE_EQ(matrix[3][2], 1.0);
  EXPECT_DOUBLE_EQ(matrix[4][0], 8.0);
  EXPECT_DOUBLE_EQ(matrix[4][4], -5.0);

  iter_bool_pair = matrix.insert(3, 2, 2.0);  // no insert test
  EXPECT_DOUBLE_EQ(*iter_bool_pair.first, 1.0);
  EXPECT_FALSE(iter_bool_pair.second);
  EXPECT_EQ(matrix.size_non_zero(), 6);
  EXPECT_DOUBLE_EQ(matrix[2][1], 4.0);
  EXPECT_DOUBLE_EQ(matrix[2][4], 5.0);
  EXPECT_DOUBLE_EQ(matrix[3][1], 3.0);
  EXPECT_DOUBLE_EQ(matrix[3][2], 1.0);
  EXPECT_DOUBLE_EQ(matrix[4][0], 8.0);
  EXPECT_DOUBLE_EQ(matrix[4][4], -5.0);

  iter_bool_pair = matrix.insert(6, 2, 10.0);  // extra rows
  EXPECT_DOUBLE_EQ(*iter_bool_pair.first, 10.0);
  EXPECT_TRUE(iter_bool_pair.second);
  EXPECT_EQ(matrix.size_row(), 7);
  EXPECT_EQ(matrix.size_non_zero(), 7);
  EXPECT_DOUBLE_EQ(matrix[6][2], 10.0);

  iter_bool_pair = matrix.insert(2, 6, 50.0);  // extra columns
  EXPECT_DOUBLE_EQ(*iter_bool_pair.first, 50.0);
  EXPECT_TRUE(iter_bool_pair.second);
  EXPECT_EQ(matrix.size_row(), 7);
  EXPECT_EQ(matrix.size_column(), 7);
  EXPECT_EQ(matrix.size_non_zero(), 8);
  EXPECT_DOUBLE_EQ(matrix[2][6], 50.0);

  iter_bool_pair = matrix.insert_or_assign(2, 6, -50.0);  // check insert_or_assign
  EXPECT_DOUBLE_EQ(*iter_bool_pair.first, -50.0);
  EXPECT_FALSE(iter_bool_pair.second);
  EXPECT_EQ(matrix.size_row(), 7);
  EXPECT_EQ(matrix.size_column(), 7);
  EXPECT_EQ(matrix.size_non_zero(), 8);
  EXPECT_DOUBLE_EQ(matrix[2][6], -50.0);

  // check ascending order has been maintained.
  FOR_EACH(row_vector, matrix) {
    auto prev = row_vector.begin();
    FOR_ITER(iter, row_vector) {
      if(iter != row_vector.begin()) {
        EXPECT_GT(iter.i_column(), prev.i_column());
        EXPECT_EQ(iter.i_row(), prev.i_row());  // more of a sanity check.
        ++prev;
      }
    }
  }
}